

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O1

void __thiscall
r_exec::CSTController::inject_goal
          (CSTController *this,HLPBindingMap *bm,Fact *super_goal,_Fact *sub_goal_target,Sim *sim,
          uint64_t now,double confidence,Code *group)

{
  atomic_int_fast64_t *paVar1;
  Sim *pSVar2;
  uint16_t uVar3;
  Goal *this_00;
  Goal *pGVar4;
  Code *pCVar5;
  Code *object;
  View *pVVar6;
  _Mem *p_Var7;
  MkRdx *this_01;
  uint16_t i;
  
  _Fact::set_cfd(sub_goal_target,confidence);
  this_00 = (Goal *)operator_new(0x160);
  pGVar4 = _Fact::get_goal(&super_goal->super__Fact);
  pCVar5 = Goal::get_actor(pGVar4);
  Goal::Goal(this_00,sub_goal_target,pCVar5,1.0);
  pSVar2 = (Sim *)(this_00->sim).object;
  if (pSVar2 != sim) {
    if (pSVar2 != (Sim *)0x0) {
      LOCK();
      paVar1 = &(pSVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pSVar2->super__Object)._vptr__Object[1])();
      }
    }
    (this_00->sim).object = &sim->super__Object;
    if (sim != (Sim *)0x0) {
      LOCK();
      paVar1 = &(sim->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  pGVar4 = _Fact::get_goal(&super_goal->super__Fact);
  pCVar5 = (Code *)Goal::get_target(pGVar4);
  object = (Code *)Fact::operator_new((Fact *)0x150,(size_t)sub_goal_target);
  Fact::Fact((Fact *)object,(Code *)this_00,now,now,1.0,1.0);
  pVVar6 = (View *)operator_new(0x100);
  r_exec::View::View(pVVar6,SYNC_ONCE,now,confidence,1,group,group,object);
  p_Var7 = (_Mem *)r_code::Mem::Get();
  _Mem::inject(p_Var7,pVVar6);
  if (sim->mode == SIM_ROOT) {
    this_01 = (MkRdx *)operator_new(0x158);
    MkRdx::MkRdx(this_01,pCVar5,(Code *)super_goal,(Code *)this_00,1.0,&bm->super_BindingMap);
    uVar3 = HLPController::get_out_group_count(&this->super_HLPController);
    if (uVar3 != 0) {
      i = 0;
      do {
        pCVar5 = HLPController::get_out_group(&this->super_HLPController,i);
        pVVar6 = (View *)operator_new(0x100);
        NotificationView::NotificationView((NotificationView *)pVVar6,group,pCVar5,(Code *)this_01);
        p_Var7 = (_Mem *)r_code::Mem::Get();
        _Mem::inject_notification(p_Var7,pVVar6,true);
        i = i + 1;
      } while (uVar3 != i);
    }
  }
  return;
}

Assistant:

void CSTController::inject_goal(HLPBindingMap *bm,
                                Fact *super_goal, // f0->g->f1->icst or f0->g->|f1->icst.
                                _Fact *sub_goal_target, // f1.
                                Sim *sim,
                                uint64_t now,
                                double confidence,
                                Code *group) const
{
    sub_goal_target->set_cfd(confidence);
    Goal *sub_goal = new Goal(sub_goal_target, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    _Fact *f_icst = super_goal->get_goal()->get_target();
    _Fact *sub_goal_f = new Fact(sub_goal, now, now, 1, 1);
    View *view = new View(View::SYNC_ONCE, now, confidence, 1, group, group, sub_goal_f); // SYNC_ONCE,res=1.
    _Mem::Get()->inject(view);

    if (sim->mode == SIM_ROOT) { // no rdx for SIM_OPTIONAL or SIM_MANDATORY.
        MkRdx *mk_rdx = new MkRdx(f_icst, super_goal, sub_goal, 1, bm);
        uint16_t out_group_count = get_out_group_count();

        for (uint16_t i = 0; i < out_group_count; ++i) {
            Group *out_group = (Group *)get_out_group(i);
            View *view = new NotificationView(group, out_group, mk_rdx);
            _Mem::Get()->inject_notification(view, true);
        }
    }
}